

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stepscheduler_kba.c
# Opt level: O0

Bool_t StepScheduler_must_do_recv
                 (StepScheduler *stepscheduler,int step,int axis,int dir_ind,int octant_in_block,
                 Env *env)

{
  int proc_x_00;
  int proc_y_00;
  int dir_00;
  StepInfo SVar1;
  StepInfo SVar2;
  undefined4 local_94;
  undefined1 local_8d;
  undefined4 local_8c;
  undefined4 local_88;
  Bool_t do_recv;
  undefined4 local_78;
  undefined4 local_6c;
  undefined4 uStack_68;
  StepInfo stepinfo_recv_target_step;
  undefined4 local_58;
  undefined4 local_50;
  undefined4 uStack_4c;
  StepInfo stepinfo_recv_source_step;
  int inc_y;
  int inc_x;
  int dir;
  Bool_t axis_y;
  Bool_t axis_x;
  int proc_y;
  int proc_x;
  Env *env_local;
  int octant_in_block_local;
  int dir_ind_local;
  int axis_local;
  int step_local;
  StepScheduler *stepscheduler_local;
  
  proc_x_00 = Env_proc_x_this(env);
  proc_y_00 = Env_proc_y_this(env);
  dir_00 = -1;
  if (dir_ind == 0) {
    dir_00 = 1;
  }
  if (axis != 0) {
    local_88 = 0;
  }
  else {
    local_88 = Dir_inc(dir_00);
  }
  if (axis == 1) {
    local_8c = Dir_inc(dir_00);
  }
  else {
    local_8c = 0;
  }
  SVar1 = StepScheduler_stepinfo
                    (stepscheduler,step,octant_in_block,proc_x_00 - local_88,proc_y_00 - local_8c);
  local_58 = SVar1.is_active;
  SVar2 = StepScheduler_stepinfo(stepscheduler,step + 1,octant_in_block,proc_x_00,proc_y_00);
  local_78 = SVar2.is_active;
  local_8d = false;
  if ((((local_58 != 0) && (local_8d = false, local_78 != 0)) &&
      (uStack_4c = SVar1.octant, uStack_68 = SVar2.octant, local_8d = false, uStack_4c == uStack_68)
      ) && (local_50 = SVar1.block_z, local_6c = SVar2.block_z, local_8d = false,
           local_50 == local_6c)) {
    if (axis != 0) {
      local_94 = Dir_y(uStack_68);
    }
    else {
      local_94 = Dir_x(uStack_68);
    }
    local_8d = local_94 == dir_00;
  }
  return (uint)local_8d;
}

Assistant:

Bool_t StepScheduler_must_do_recv(
  StepScheduler* stepscheduler,
  int            step,
  int            axis,
  int            dir_ind,
  int            octant_in_block,
  Env*           env )
{
  const int proc_x = Env_proc_x_this( env );
  const int proc_y = Env_proc_y_this( env );

  const Bool_t axis_x = axis==0;
  const Bool_t axis_y = axis==1;

  const int dir = dir_ind==0 ? (int)DIR_UP : (int)DIR_DN;
  const int inc_x = axis_x ? Dir_inc( dir ) : 0;
  const int inc_y = axis_y ? Dir_inc( dir ) : 0;

  /*---Get step info for processors involved in communication---*/

  const StepInfo stepinfo_recv_source_step = StepScheduler_stepinfo(
    stepscheduler, step,   octant_in_block, proc_x-inc_x, proc_y-inc_y );

  const StepInfo stepinfo_recv_target_step = StepScheduler_stepinfo(
    stepscheduler, step+1, octant_in_block, proc_x,       proc_y       );

  /*---Determine whether to communicate---*/

  Bool_t const do_recv = stepinfo_recv_source_step.is_active
                      && stepinfo_recv_target_step.is_active
                      && stepinfo_recv_source_step.octant ==
                         stepinfo_recv_target_step.octant
                      && stepinfo_recv_source_step.block_z ==
                         stepinfo_recv_target_step.block_z
                      && ( axis_x ?
                           Dir_x( stepinfo_recv_target_step.octant ) :
                           Dir_y( stepinfo_recv_target_step.octant ) ) == dir;

  return do_recv;
}